

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

bool anon_unknown.dwarf_ecfb9a::IsBinarySTL(char *buffer,uint fileSize)

{
  uint32_t expectedBinaryFileSize;
  uint32_t faceCount;
  char *facecount_pos;
  uint fileSize_local;
  char *buffer_local;
  
  if (fileSize < 0x54) {
    buffer_local._7_1_ = false;
  }
  else {
    buffer_local._7_1_ = *(int *)(buffer + 0x50) * 0x32 + 0x54U == fileSize;
  }
  return buffer_local._7_1_;
}

Assistant:

static bool IsBinarySTL(const char* buffer, unsigned int fileSize) {
    if( fileSize < 84 ) {
        return false;
    }

    const char *facecount_pos = buffer + 80;
    uint32_t faceCount( 0 );
    ::memcpy( &faceCount, facecount_pos, sizeof( uint32_t ) );
    const uint32_t expectedBinaryFileSize = faceCount * 50 + 84;

    return expectedBinaryFileSize == fileSize;
}